

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O2

void mxx::impl::allgather_big<long>(long *data,size_t size,long *out,comm *comm)

{
  datatype dt;
  datatype dt_1;
  
  dt_1._vptr_datatype = (_func_int **)&PTR__datatype_0015b1c8;
  dt_1.mpitype = (MPI_Datatype)&ompi_mpi_long;
  dt_1.builtin = true;
  datatype::contiguous(&dt,&dt_1,size);
  datatype::~datatype(&dt_1);
  MPI_Allgather(data,1,dt.mpitype,out,1,dt.mpitype,comm->mpi_comm);
  datatype::~datatype(&dt);
  return;
}

Assistant:

void allgather_big(const T* data, size_t size, T* out, const mxx::comm& comm) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
    MPI_Allgather(const_cast<T*>(data), 1, dt.type(), out, 1, dt.type(), comm);
}